

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
closest_gap(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
            *this,int pos)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar7;
  
  iVar4 = this->data_capacity_;
  uVar7 = iVar4 - 1;
  if ((int)uVar7 < pos) {
    pos = uVar7;
  }
  uVar3 = pos >> 6;
  uVar10 = pos & 0x3f;
  puVar1 = this->bitmap_;
  uVar2 = puVar1[(int)uVar3];
  if ((uVar2 != 0xffffffffffffffff) &&
     ((iVar12 = this->bitmap_size_, uVar3 != iVar12 - 1U ||
      (POPCOUNT(uVar2) != (long)(iVar4 + iVar12 * -0x40 + 0x40))))) {
    uVar18 = ~uVar2 & -1L << uVar10;
    if (uVar18 == 0) {
      iVar8 = 0x40;
      if ((int)(uVar3 + 1) < iVar12) {
        iVar12 = 0;
        for (uVar18 = ~puVar1[(int)(uVar3 + 1)]; (uVar18 & 1) == 0;
            uVar18 = uVar18 >> 1 | 0x8000000000000000) {
          iVar12 = iVar12 + 1;
        }
        iVar8 = (iVar12 - uVar10) + 0x40;
      }
    }
    else {
      iVar8 = 0;
      for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        iVar8 = iVar8 + 1;
      }
      iVar8 = iVar8 - uVar10;
    }
    uVar2 = -1L << uVar10 | uVar2;
    if (uVar2 == 0xffffffffffffffff) {
      if ((int)uVar3 < 1) {
        iVar12 = 0x40;
      }
      else {
        iVar12 = uVar10 + 1 + (int)LZCOUNT(~puVar1[(ulong)uVar3 - 1]);
      }
    }
    else {
      iVar12 = (uVar10 - 0x3f) + (int)LZCOUNT(~uVar2);
    }
    iVar19 = iVar8 + pos;
    if (iVar4 <= iVar8 + pos) {
      iVar19 = pos - iVar12;
    }
    if (iVar8 < iVar12) {
      return iVar19;
    }
    return pos - iVar12;
  }
  iVar12 = (int)uVar7 >> 6;
  uVar13 = iVar12 - uVar3;
  uVar7 = uVar3;
  if ((int)uVar13 < (int)uVar3) {
    uVar7 = uVar13;
  }
  iVar8 = 1;
  while (iVar19 = (int)uVar2, iVar8 <= (int)uVar7) {
    uVar16 = uVar3 - iVar8;
    uVar18 = puVar1[(int)uVar16];
    iVar19 = iVar8 + uVar3;
    uVar15 = puVar1[iVar19];
    if ((uVar18 == 0xffffffffffffffff) || (uVar15 == 0xffffffffffffffff)) {
      if (uVar18 != 0xffffffffffffffff) {
        uVar16 = uVar16 * 0x40 + 0x40 + ~(uint)LZCOUNT(~uVar18);
        uVar2 = (ulong)uVar16;
        if (((0x20 < uVar10) && (iVar19 = iVar19 + 1, iVar19 < this->bitmap_size_)) &&
           (puVar1[iVar19] != 0xffffffffffffffff)) {
          iVar5 = 0;
          for (uVar18 = ~puVar1[iVar19]; (uVar18 & 1) == 0;
              uVar18 = uVar18 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          uVar17 = iVar5 + iVar19 * 0x40;
          if ((int)(uVar17 - pos) < (int)(pos - uVar16)) {
            uVar16 = uVar17;
          }
          if ((int)uVar17 < iVar4) {
            uVar2 = (ulong)uVar16;
          }
        }
        goto LAB_00147230;
      }
      if (uVar15 != 0xffffffffffffffff) {
        iVar5 = 0;
        for (uVar15 = ~uVar15; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          iVar5 = iVar5 + 1;
        }
        uVar17 = iVar5 + iVar19 * 0x40;
        if (((int)uVar17 < iVar4) && (uVar2 = (ulong)uVar17, 0 < (int)uVar16 && uVar10 < 0x20)) {
          uVar2 = (ulong)uVar17;
          if ((puVar1[(ulong)uVar16 - 1] != 0xffffffffffffffff) &&
             (uVar16 = ~(uint)LZCOUNT(~puVar1[(ulong)uVar16 - 1]) + uVar16 * 0x40,
             uVar2 = (ulong)uVar16, (int)(uVar17 - pos) < (int)(pos - uVar16))) {
            uVar2 = (ulong)uVar17;
          }
        }
        if ((int)uVar17 < iVar4) goto LAB_00147230;
      }
      iVar8 = iVar8 + 1;
      bVar6 = true;
    }
    else {
      uVar16 = uVar16 * 0x40 + 0x40 + ~(uint)LZCOUNT(~uVar18);
      iVar5 = 0;
      for (uVar15 = ~uVar15; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        iVar5 = iVar5 + 1;
      }
      uVar14 = iVar5 + iVar19 * 0x40;
      uVar17 = uVar16;
      if ((int)(uVar14 - pos) < (int)(pos - uVar16)) {
        uVar17 = uVar14;
      }
      if (iVar4 <= (int)uVar14) {
        uVar17 = uVar16;
      }
      uVar2 = (ulong)uVar17;
LAB_00147230:
      bVar6 = false;
    }
    if (!bVar6) {
      return (int)uVar2;
    }
  }
  if ((int)uVar13 < (int)uVar3) {
    uVar3 = uVar3 - iVar8;
    uVar2 = (ulong)uVar3;
    uVar7 = uVar3 >> 0x1f;
    bVar6 = SUB41(uVar3 >> 0x1f,0);
    if (-1 < (int)uVar3) {
      uVar18 = puVar1[uVar3];
      while( true ) {
        bVar6 = SUB41(uVar7,0);
        iVar4 = (int)uVar2;
        if (uVar18 != 0xffffffffffffffff) break;
        bVar6 = iVar4 < 1;
        uVar7 = (uint)bVar6;
        if (iVar4 < 1) goto LAB_00147372;
        uVar2 = (ulong)(iVar4 - 1);
        uVar18 = puVar1[uVar2];
      }
      iVar19 = iVar4 * 0x40 + 0x40 + ~(uint)LZCOUNT(~uVar18);
    }
LAB_00147372:
    if (bVar6 == false) {
      return iVar19;
    }
  }
  else {
    iVar5 = uVar3 + iVar8;
    bVar6 = iVar12 < iVar5;
    if (iVar5 <= iVar12) {
      lVar11 = (long)iVar5;
      uVar2 = puVar1[lVar11];
      if (uVar2 == 0xffffffffffffffff) {
        lVar9 = 0;
        do {
          if (uVar13 - iVar8 == (int)lVar9) {
            bVar6 = (long)iVar12 <= lVar11 + lVar9;
            goto LAB_0014735a;
          }
          uVar2 = puVar1[lVar11 + lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (uVar2 == 0xffffffffffffffff);
        bVar6 = (long)iVar12 <= lVar11 + -1 + lVar9;
        iVar5 = iVar5 + (int)lVar9;
      }
      iVar12 = 0;
      for (uVar2 = ~uVar2; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
        iVar12 = iVar12 + 1;
      }
      iVar12 = iVar12 + iVar5 * 0x40;
      iVar19 = -1;
      if (iVar12 < iVar4) {
        iVar19 = iVar12;
      }
    }
LAB_0014735a:
    if (!bVar6) {
      return iVar19;
    }
  }
  return -1;
}

Assistant:

int closest_gap(int pos) const {
    pos = std::min(pos, data_capacity_ - 1);
    int bitmap_pos = pos >> 6;
    int bit_pos = pos - (bitmap_pos << 6);
    if (bitmap_[bitmap_pos] == static_cast<uint64_t>(-1) ||
        (bitmap_pos == bitmap_size_ - 1 &&
         _mm_popcnt_u64(bitmap_[bitmap_pos]) ==
             data_capacity_ - ((bitmap_size_ - 1) << 6))) {
      // no gaps in this block of 64 positions, start searching in adjacent
      // blocks
      int left_bitmap_pos = 0;
      int right_bitmap_pos = ((data_capacity_ - 1) >> 6);  // inclusive
      int max_left_bitmap_offset = bitmap_pos - left_bitmap_pos;
      int max_right_bitmap_offset = right_bitmap_pos - bitmap_pos;
      int max_bidirectional_bitmap_offset =
          std::min<int>(max_left_bitmap_offset, max_right_bitmap_offset);
      int bitmap_distance = 1;
      while (bitmap_distance <= max_bidirectional_bitmap_offset) {
        uint64_t left_bitmap_data = bitmap_[bitmap_pos - bitmap_distance];
        uint64_t right_bitmap_data = bitmap_[bitmap_pos + bitmap_distance];
        if (left_bitmap_data != static_cast<uint64_t>(-1) &&
            right_bitmap_data != static_cast<uint64_t>(-1)) {
          int left_gap_pos = ((bitmap_pos - bitmap_distance + 1) << 6) -
                             static_cast<int>(_lzcnt_u64(~left_bitmap_data)) -
                             1;
          int right_gap_pos = ((bitmap_pos + bitmap_distance) << 6) +
                              static_cast<int>(_tzcnt_u64(~right_bitmap_data));
          if (pos - left_gap_pos <= right_gap_pos - pos ||
              right_gap_pos >= data_capacity_) {
            return left_gap_pos;
          } else {
            return right_gap_pos;
          }
        } else if (left_bitmap_data != static_cast<uint64_t>(-1)) {
          int left_gap_pos = ((bitmap_pos - bitmap_distance + 1) << 6) -
                             static_cast<int>(_lzcnt_u64(~left_bitmap_data)) -
                             1;
          // also need to check next block to the right
          if (bit_pos > 32 && bitmap_pos + bitmap_distance + 1 < bitmap_size_ &&
              bitmap_[bitmap_pos + bitmap_distance + 1] !=
                  static_cast<uint64_t>(-1)) {
            int right_gap_pos =
                ((bitmap_pos + bitmap_distance + 1) << 6) +
                static_cast<int>(
                    _tzcnt_u64(~bitmap_[bitmap_pos + bitmap_distance + 1]));
            if (pos - left_gap_pos <= right_gap_pos - pos ||
                right_gap_pos >= data_capacity_) {
              return left_gap_pos;
            } else {
              return right_gap_pos;
            }
          } else {
            return left_gap_pos;
          }
        } else if (right_bitmap_data != static_cast<uint64_t>(-1)) {
          int right_gap_pos = ((bitmap_pos + bitmap_distance) << 6) +
                              static_cast<int>(_tzcnt_u64(~right_bitmap_data));
          if (right_gap_pos < data_capacity_) {
            // also need to check next block to the left
            if (bit_pos < 32 && bitmap_pos - bitmap_distance > 0 &&
                bitmap_[bitmap_pos - bitmap_distance - 1] !=
                    static_cast<uint64_t>(-1)) {
              int left_gap_pos =
                  ((bitmap_pos - bitmap_distance) << 6) -
                  static_cast<int>(
                      _lzcnt_u64(~bitmap_[bitmap_pos - bitmap_distance - 1])) -
                  1;
              if (pos - left_gap_pos <= right_gap_pos - pos ||
                  right_gap_pos >= data_capacity_) {
                return left_gap_pos;
              } else {
                return right_gap_pos;
              }
            } else {
              return right_gap_pos;
            }
          }
        }
        bitmap_distance++;
      }
      if (max_left_bitmap_offset > max_right_bitmap_offset) {
        for (int i = bitmap_pos - bitmap_distance; i >= left_bitmap_pos; i--) {
          if (bitmap_[i] != static_cast<uint64_t>(-1)) {
            return ((i + 1) << 6) - static_cast<int>(_lzcnt_u64(~bitmap_[i])) -
                   1;
          }
        }
      } else {
        for (int i = bitmap_pos + bitmap_distance; i <= right_bitmap_pos; i++) {
          if (bitmap_[i] != static_cast<uint64_t>(-1)) {
            int right_gap_pos =
                (i << 6) + static_cast<int>(_tzcnt_u64(~bitmap_[i]));
            if (right_gap_pos >= data_capacity_) {
              return -1;
            } else {
              return right_gap_pos;
            }
          }
        }
      }
      return -1;
    } else {
      // search within block of 64 positions
      uint64_t bitmap_data = bitmap_[bitmap_pos];
      int closest_right_gap_distance = 64;
      int closest_left_gap_distance = 64;
      // Logically gaps to the right of pos, in the bitmap these are gaps to the
      // left of pos's bit
      // This covers the case where pos is a gap
      // For example, if pos is 3, then bitmap '10101101' -> bitmap_right_gaps
      // '01010000'
      uint64_t bitmap_right_gaps = ~(bitmap_data | ((1ULL << bit_pos) - 1));
      if (bitmap_right_gaps != 0) {
        closest_right_gap_distance =
            static_cast<int>(_tzcnt_u64(bitmap_right_gaps)) - bit_pos;
      } else if (bitmap_pos + 1 < bitmap_size_) {
        // look in the next block to the right
        closest_right_gap_distance =
            64 + static_cast<int>(_tzcnt_u64(~bitmap_[bitmap_pos + 1])) -
            bit_pos;
      }
      // Logically gaps to the left of pos, in the bitmap these are gaps to the
      // right of pos's bit
      // For example, if pos is 3, then bitmap '10101101' -> bitmap_left_gaps
      // '00000010'
      uint64_t bitmap_left_gaps = (~bitmap_data) & ((1ULL << bit_pos) - 1);
      if (bitmap_left_gaps != 0) {
        closest_left_gap_distance =
            bit_pos - (63 - static_cast<int>(_lzcnt_u64(bitmap_left_gaps)));
      } else if (bitmap_pos > 0) {
        // look in the next block to the left
        closest_left_gap_distance =
            bit_pos + static_cast<int>(_lzcnt_u64(~bitmap_[bitmap_pos - 1])) +
            1;
      }

      if (closest_right_gap_distance < closest_left_gap_distance &&
          pos + closest_right_gap_distance < data_capacity_) {
        return pos + closest_right_gap_distance;
      } else {
        return pos - closest_left_gap_distance;
      }
    }
  }